

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

CBString * __thiscall
Bstrlib::CBString::operator+(CBString *__return_storage_ptr__,CBString *this,char c)

{
  CBString(__return_storage_ptr__,this);
  operator+=(__return_storage_ptr__,c);
  return __return_storage_ptr__;
}

Assistant:

const CBString CBString::operator + (char c) const {
	CBString retval (*this);
	retval += c;
	return retval;
}